

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

EffectiveSign __thiscall
anon_unknown.dwarf_1a655b8::EffectiveSignVisitor::visit<slang::ast::UnbasedUnsizedIntegerLiteral>
          (EffectiveSignVisitor *this,UnbasedUnsizedIntegerLiteral *expr)

{
  bool bVar1;
  UnbasedUnsizedIntegerLiteral *in_RSI;
  Expression *in_RDI;
  EffectiveSign local_4;
  
  bVar1 = slang::ast::Expression::bad(in_RDI);
  if (bVar1) {
    local_4 = Either;
  }
  else {
    local_4 = slang::ast::UnbasedUnsizedIntegerLiteral::getEffectiveSignImpl
                        (in_RSI,(bool)((char)in_RDI->kind & IntegerLiteral));
  }
  return local_4;
}

Assistant:

EffectiveSign visit(const T& expr) {
        if constexpr (requires { expr.getEffectiveSignImpl(isForConversion); }) {
            if (expr.bad())
                return EffectiveSign::Either;

            return expr.getEffectiveSignImpl(isForConversion);
        }
        else {
            return expr.type->isSigned() ? EffectiveSign::Signed : EffectiveSign::Unsigned;
        }
    }